

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O3

void Abc_NtkTrasferNamesNoLatches(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkNew)

{
  undefined8 *puVar1;
  Abc_Obj_t *pAVar2;
  long *plVar3;
  int iVar4;
  char *pcVar5;
  undefined8 *puVar6;
  Vec_Ptr_t *pVVar7;
  int *piVar8;
  long lVar9;
  
  if (pNtk->vPis->nSize != pNtkNew->vPis->nSize) {
    __assert_fail("Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                  ,0xad,"void Abc_NtkTrasferNamesNoLatches(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->vPos->nSize != pNtkNew->vPos->nSize) {
    __assert_fail("Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                  ,0xae,"void Abc_NtkTrasferNamesNoLatches(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar4 = Nm_ManNumEntries(pNtk->pManName);
  if (iVar4 < 1) {
    __assert_fail("Nm_ManNumEntries(pNtk->pManName) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                  ,0xaf,"void Abc_NtkTrasferNamesNoLatches(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar4 = Nm_ManNumEntries(pNtkNew->pManName);
  if (iVar4 != 0) {
    __assert_fail("Nm_ManNumEntries(pNtkNew->pManName) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                  ,0xb0,"void Abc_NtkTrasferNamesNoLatches(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  pVVar7 = pNtk->vCis;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      puVar1 = (undefined8 *)pVVar7->pArray[lVar9];
      piVar8 = (int *)*puVar1;
      if ((*(int *)((long)puVar1 + 0x1c) == 0) ||
         ((*(uint *)(*(long *)(*(long *)(*(long *)(piVar8 + 8) + 8) + (long)*(int *)puVar1[4] * 8) +
                    0x14) & 0xf) != 8)) {
        puVar6 = puVar1;
        if (*piVar8 == 1) {
          puVar6 = *(undefined8 **)
                    (*(long *)(*(long *)(piVar8 + 8) + 8) + (long)*(int *)puVar1[6] * 8);
          piVar8 = (int *)*puVar6;
        }
        pAVar2 = (Abc_Obj_t *)puVar1[8];
        pcVar5 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(piVar8 + 6),*(int *)(puVar6 + 2));
        Abc_ObjAssignName(pAVar2,pcVar5,(char *)0x0);
        pVVar7 = pNtk->vCis;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar7->nSize);
  }
  pVVar7 = pNtk->vCos;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      puVar1 = (undefined8 *)pVVar7->pArray[lVar9];
      piVar8 = (int *)*puVar1;
      if ((*(int *)((long)puVar1 + 0x2c) == 0) ||
         ((*(uint *)(*(long *)(*(long *)(*(long *)(piVar8 + 8) + 8) + (long)*(int *)puVar1[6] * 8) +
                    0x14) & 0xf) != 8)) {
        puVar6 = puVar1;
        if (*piVar8 == 1) {
          puVar6 = *(undefined8 **)
                    (*(long *)(*(long *)(piVar8 + 8) + 8) + (long)*(int *)puVar1[4] * 8);
          piVar8 = (int *)*puVar6;
        }
        pAVar2 = (Abc_Obj_t *)puVar1[8];
        pcVar5 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(piVar8 + 6),*(int *)(puVar6 + 2));
        Abc_ObjAssignName(pAVar2,pcVar5,(char *)0x0);
        pVVar7 = pNtk->vCos;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar7->nSize);
  }
  pVVar7 = pNtk->vBoxes;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      plVar3 = (long *)pVVar7->pArray[lVar9];
      if ((*(uint *)((long)plVar3 + 0x14) & 0xf) != 8) {
        pAVar2 = (Abc_Obj_t *)plVar3[8];
        pcVar5 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar3 + 0x18),(int)plVar3[2]);
        Abc_ObjAssignName(pAVar2,pcVar5,(char *)0x0);
        pVVar7 = pNtk->vBoxes;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar7->nSize);
  }
  return;
}

Assistant:

void Abc_NtkTrasferNamesNoLatches( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkNew )
{
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew) );
    assert( Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkNew) );
    assert( Nm_ManNumEntries(pNtk->pManName) > 0 );
    assert( Nm_ManNumEntries(pNtkNew->pManName) == 0 );
    // copy the CI/CO/box name and skip latches and theirs inputs/outputs
    Abc_NtkForEachCi( pNtk, pObj, i )
        if ( Abc_ObjFaninNum(pObj) == 0 || !Abc_ObjIsLatch(Abc_ObjFanin0(pObj)) )
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(Abc_ObjFanout0Ntk(pObj)), NULL );
    Abc_NtkForEachCo( pNtk, pObj, i ) 
        if ( Abc_ObjFanoutNum(pObj) == 0 || !Abc_ObjIsLatch(Abc_ObjFanout0(pObj)) )
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(Abc_ObjFanin0Ntk(pObj)), NULL );
    Abc_NtkForEachBox( pNtk, pObj, i ) 
        if ( !Abc_ObjIsLatch(pObj) )
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
}